

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

uint32_t asmjit::v1_14::CodeHolder_hashNameAndGetSize(char *name,size_t *nameSize)

{
  Error EVar1;
  ulong *in_RSI;
  long in_RDI;
  uint8_t c_1;
  size_t i_1;
  uint8_t c;
  size_t i;
  uint32_t hashCode;
  ulong local_48;
  ulong local_38;
  uint32_t local_2c;
  
  local_2c = 0;
  if (*in_RSI == 0xffffffffffffffff) {
    for (local_38 = 0; *(byte *)(in_RDI + local_38) != 0; local_38 = local_38 + 1) {
      local_2c = local_2c * 0x1003f + (uint)*(byte *)(in_RDI + local_38);
    }
    *in_RSI = local_38;
  }
  else {
    for (local_48 = 0; local_48 < *in_RSI; local_48 = local_48 + 1) {
      if (*(byte *)(in_RDI + local_48) == 0) {
        EVar1 = DebugUtils::errored(0x11);
        return EVar1;
      }
      local_2c = local_2c * 0x1003f + (uint)*(byte *)(in_RDI + local_48);
    }
  }
  return local_2c;
}

Assistant:

static uint32_t CodeHolder_hashNameAndGetSize(const char* name, size_t& nameSize) noexcept {
  uint32_t hashCode = 0;
  if (nameSize == SIZE_MAX) {
    size_t i = 0;
    for (;;) {
      uint8_t c = uint8_t(name[i]);
      if (!c) break;
      hashCode = Support::hashRound(hashCode, c);
      i++;
    }
    nameSize = i;
  }
  else {
    for (size_t i = 0; i < nameSize; i++) {
      uint8_t c = uint8_t(name[i]);
      if (ASMJIT_UNLIKELY(!c)) return DebugUtils::errored(kErrorInvalidLabelName);
      hashCode = Support::hashRound(hashCode, c);
    }
  }
  return hashCode;
}